

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRoundedRectangleProfileDef::IfcRoundedRectangleProfileDef
          (IfcRoundedRectangleProfileDef *this)

{
  *(undefined ***)&this->field_0xa8 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0xb0 = 0;
  *(char **)&this->field_0xb8 = "IfcRoundedRectangleProfileDef";
  IfcRectangleProfileDef::IfcRectangleProfileDef
            (&this->super_IfcRectangleProfileDef,&PTR_construction_vtable_24__007ab930);
  *(undefined8 *)&(this->super_IfcRectangleProfileDef).field_0x98 = 0;
  (this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7ab878;
  *(undefined8 *)&this->field_0xa8 = 0x7ab918;
  *(undefined8 *)
   &(this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
    field_0x58 = 0x7ab8a0;
  *(undefined8 *)&(this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.field_0x70 =
       0x7ab8c8;
  *(undefined8 *)&(this->super_IfcRectangleProfileDef).field_0x90 = 0x7ab8f0;
  return;
}

Assistant:

IfcRoundedRectangleProfileDef() : Object("IfcRoundedRectangleProfileDef") {}